

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

bool google::protobuf::internal::ReflectionOps::IsInitialized
               (Message *message,bool check_fields,bool check_descendants)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  FieldDescriptor **v1;
  FieldDescriptor **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  Descriptor *this;
  MessageOptions *this_00;
  FieldDescriptor *this_01;
  MapFieldBase *this_02;
  MapValueConstRef *this_03;
  MessageLite *pMVar5;
  MessageFactory *pMVar6;
  undefined4 extraout_var;
  ExtensionSet *this_04;
  Message *extendee;
  int j;
  int size;
  MapIterator end_map;
  MapIterator it;
  MapFieldBase *map_field;
  Descriptor *message_type;
  FieldDescriptor *field_1;
  FieldDescriptor *field;
  LogMessage local_78;
  Voidify local_61;
  FieldDescriptor *local_60;
  FieldDescriptor *local_58;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *end;
  FieldDescriptor *begin;
  Reflection *pRStack_30;
  int field_count;
  Reflection *reflection;
  Descriptor *descriptor;
  bool check_descendants_local;
  Message *pMStack_18;
  bool check_fields_local;
  Message *message_local;
  
  descriptor._6_1_ = check_descendants;
  descriptor._7_1_ = check_fields;
  pMStack_18 = message;
  reflection = (Reflection *)Message::GetDescriptor(message);
  pRStack_30 = GetReflectionOrDie(pMStack_18);
  begin._4_4_ = Descriptor::field_count((Descriptor *)reflection);
  if (begin._4_4_ != 0) {
    end = Descriptor::field((Descriptor *)reflection,0);
    absl_log_internal_check_op_result = (Nullable<const_char_*>)(end + begin._4_4_);
    local_58 = Descriptor::field((Descriptor *)reflection,begin._4_4_ + -1);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_58);
    local_60 = (FieldDescriptor *)(absl_log_internal_check_op_result + -0x58);
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_60);
    local_50 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                         (v1,v2,"descriptor->field(field_count - 1) == end - 1");
    if (local_50 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_50);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
                 ,0xb3,failure_msg);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_78);
    }
    local_50 = (Nullable<const_char_*>)0x0;
    if ((descriptor._7_1_ & 1) != 0) {
      for (field_1 = end; field_1 != (FieldDescriptor *)absl_log_internal_check_op_result;
          field_1 = field_1 + 1) {
        bVar1 = FieldDescriptor::is_required(field_1);
        if ((bVar1) && (bVar1 = Reflection::HasField(pRStack_30,pMStack_18,field_1), !bVar1)) {
          return false;
        }
      }
    }
    if ((descriptor._6_1_ & 1) != 0) {
      for (message_type = (Descriptor *)end;
          message_type != (Descriptor *)absl_log_internal_check_op_result;
          message_type = (Descriptor *)&message_type->enum_types_) {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)message_type);
        if (CVar2 == CPPTYPE_MESSAGE) {
          this = FieldDescriptor::message_type((FieldDescriptor *)message_type);
          this_00 = Descriptor::options(this);
          bVar1 = MessageOptions::map_entry(this_00);
          if (bVar1) {
            this_01 = Descriptor::field(this,1);
            CVar2 = FieldDescriptor::cpp_type(this_01);
            if (CVar2 == CPPTYPE_MESSAGE) {
              this_02 = Reflection::GetMapData
                                  (pRStack_30,pMStack_18,(FieldDescriptor *)message_type);
              bVar1 = MapFieldBase::IsMapValid(this_02);
              if (bVar1) {
                MapIterator::MapIterator
                          ((MapIterator *)&end_map.value_.super_MapValueConstRef.type_,pMStack_18,
                           (FieldDescriptor *)message_type);
                MapIterator::MapIterator
                          ((MapIterator *)&j,pMStack_18,(FieldDescriptor *)message_type);
                MapFieldBase::MapBegin
                          (this_02,(MapIterator *)&end_map.value_.super_MapValueConstRef.type_);
                MapFieldBase::MapEnd(this_02,(MapIterator *)&j);
                while (bVar1 = protobuf::operator!=
                                         ((MapIterator *)
                                          &end_map.value_.super_MapValueConstRef.type_,
                                          (MapIterator *)&j), bVar1) {
                  this_03 = &MapIterator::GetValueRef
                                       ((MapIterator *)&end_map.value_.super_MapValueConstRef.type_)
                             ->super_MapValueConstRef;
                  pMVar5 = &MapValueConstRef::GetMessageValue(this_03)->super_MessageLite;
                  bVar1 = MessageLite::IsInitialized(pMVar5);
                  if (!bVar1) {
                    return false;
                  }
                  MapIterator::operator++
                            ((MapIterator *)&end_map.value_.super_MapValueConstRef.type_);
                }
              }
            }
          }
          else {
            bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)message_type);
            if (bVar1) {
              iVar3 = Reflection::FieldSize(pRStack_30,pMStack_18,(FieldDescriptor *)message_type);
              for (extendee._0_4_ = 0; (int)extendee < iVar3; extendee._0_4_ = (int)extendee + 1) {
                pMVar5 = &Reflection::GetRepeatedMessage
                                    (pRStack_30,pMStack_18,(FieldDescriptor *)message_type,
                                     (int)extendee)->super_MessageLite;
                bVar1 = MessageLite::IsInitialized(pMVar5);
                if (!bVar1) {
                  return false;
                }
              }
            }
            else {
              bVar1 = Reflection::HasField(pRStack_30,pMStack_18,(FieldDescriptor *)message_type);
              if (bVar1) {
                pMVar5 = &Reflection::GetMessage
                                    (pRStack_30,pMStack_18,(FieldDescriptor *)message_type,
                                     (MessageFactory *)0x0)->super_MessageLite;
                bVar1 = MessageLite::IsInitialized(pMVar5);
                if (!bVar1) {
                  return false;
                }
              }
            }
          }
        }
      }
    }
  }
  if (((descriptor._6_1_ & 1) != 0) &&
     (bVar1 = Reflection::HasExtensionSet(pRStack_30,pMStack_18), bVar1)) {
    pMVar6 = MessageFactory::generated_factory();
    iVar3 = (*pMVar6->_vptr_MessageFactory[2])(pMVar6,reflection);
    this_04 = Reflection::GetExtensionSet(pRStack_30,pMStack_18);
    bVar1 = ExtensionSet::IsInitialized(this_04,(MessageLite *)CONCAT44(extraout_var,iVar3));
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message, bool check_fields,
                                  bool check_descendants) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);
  if (const int field_count = descriptor->field_count()) {
    const FieldDescriptor* begin = descriptor->field(0);
    const FieldDescriptor* end = begin + field_count;
    ABSL_DCHECK_EQ(descriptor->field(field_count - 1), end - 1);

    if (check_fields) {
      // Check required fields of this message.
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->is_required() && !reflection->HasField(message, field)) {
          return false;
        }
      }
    }

    if (check_descendants) {
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const Descriptor* message_type = field->message_type();
          if (ABSL_PREDICT_FALSE(message_type->options().map_entry())) {
            if (message_type->field(1)->cpp_type() ==
                FieldDescriptor::CPPTYPE_MESSAGE) {
              const MapFieldBase* map_field =
                  reflection->GetMapData(message, field);
              if (map_field->IsMapValid()) {
                MapIterator it(const_cast<Message*>(&message), field);
                MapIterator end_map(const_cast<Message*>(&message), field);
                for (map_field->MapBegin(&it), map_field->MapEnd(&end_map);
                     it != end_map; ++it) {
                  if (!it.GetValueRef().GetMessageValue().IsInitialized()) {
                    return false;
                  }
                }
              }
            }
          } else if (field->is_repeated()) {
            const int size = reflection->FieldSize(message, field);
            for (int j = 0; j < size; j++) {
              if (!reflection->GetRepeatedMessage(message, field, j)
                       .IsInitialized()) {
                return false;
              }
            }
          } else if (reflection->HasField(message, field)) {
            if (!reflection->GetMessage(message, field).IsInitialized()) {
              return false;
            }
          }
        }
      }
    }
  }
  if (check_descendants && reflection->HasExtensionSet(message)) {
    // Note that "extendee" is only referenced if the extension is lazily parsed
    // (e.g. LazyMessageExtensionImpl), which requires a verification function
    // to be generated.
    //
    // Dynamic messages would get null prototype from the generated message
    // factory but their verification functions are not generated. Therefore, it
    // it will always be eagerly parsed and "extendee" here will not be
    // referenced.
    const Message* extendee =
        MessageFactory::generated_factory()->GetPrototype(descriptor);
    if (!reflection->GetExtensionSet(message).IsInitialized(extendee)) {
      return false;
    }
  }
  return true;
}